

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speaker_positioning.c
# Opt level: O1

int mixed_compute_gains(float *position,float *gains,mixed_channel_t *speakers,
                       mixed_channel_t *count,vbap_data *data)

{
  mixed_channel_t mVar1;
  byte bVar2;
  float *pfVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  mixed_channel_t mVar7;
  mixed_channel_t mVar8;
  float *pfVar9;
  long lVar10;
  float fVar11;
  undefined1 auVar12 [16];
  float fVar13;
  float fVar14;
  undefined1 auVar15 [64];
  float fVar16;
  float gain [3];
  undefined8 local_48;
  float local_40;
  mixed_channel_t *local_38;
  
  mVar1 = data->dims;
  fVar11 = position[2] * position[2] + *position * *position + position[1] * position[1];
  local_38 = count;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    auVar12 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
    fVar11 = auVar12._0_4_;
  }
  fVar16 = 0.0;
  fVar14 = 0.0;
  fVar13 = 0.0;
  if (0.0 < fVar11) {
    fVar13 = *position / fVar11;
    fVar14 = position[1] / fVar11;
    fVar16 = position[2] / fVar11;
  }
  if ((((fVar13 == 0.0) && (fVar14 == 0.0)) && (fVar16 == 0.0)) && (!NAN(fVar16))) {
    if (mVar1 == '\x03') {
      fVar14 = -1.0;
    }
    else {
      fVar16 = 1.0;
    }
  }
  if (data->set_count < 1) {
    uVar4 = 0;
  }
  else {
    pfVar3 = data->sets[0].inv_mat + 2;
    auVar15 = ZEXT464(0xff800000);
    uVar5 = 0;
    uVar4 = 0;
    mVar7 = mVar1;
    do {
      local_40 = 0.0;
      local_48 = 0;
      auVar12 = SUB6416(ZEXT464(0x7f800000),0);
      mVar8 = mVar1;
      if ('\0' < (char)mVar1) {
        lVar10 = 0;
        pfVar9 = pfVar3;
        do {
          fVar11 = fVar16 * *pfVar9 + fVar13 * pfVar9[-2] + fVar14 * pfVar9[-1];
          *(float *)((long)&local_48 + lVar10 * 4) = fVar11;
          mVar8 = mVar8 + 0xff + (fVar11 < -0.01);
          auVar12 = vminss_avx(ZEXT416((uint)fVar11),auVar12);
          lVar10 = lVar10 + 1;
          pfVar9 = pfVar9 + 3;
        } while ((char)mVar1 != lVar10);
      }
      if ((auVar15._0_4_ < auVar12._0_4_) && ((char)mVar8 <= (char)mVar7)) {
        gains[2] = local_40;
        *(undefined8 *)gains = local_48;
        auVar15 = ZEXT1664(auVar12);
        uVar4 = uVar5 & 0xffffffff;
        mVar7 = mVar8;
      }
      uVar5 = uVar5 + 1;
      pfVar3 = pfVar3 + 10;
    } while ((long)uVar5 < (long)data->set_count);
    uVar4 = uVar4 & 0xff;
  }
  speakers[2] = data->sets[uVar4].speakers[2];
  *(undefined2 *)speakers = *(undefined2 *)data->sets[uVar4].speakers;
  if ((char)mVar1 < '\x01') {
    uVar6 = 1;
  }
  else {
    bVar2 = 1;
    lVar10 = 0;
    do {
      if (gains[lVar10] < -0.01) {
        gains[lVar10] = 0.0001;
        bVar2 = 0;
      }
      lVar10 = lVar10 + 1;
    } while ((char)mVar1 != lVar10);
    uVar6 = (uint)bVar2;
  }
  fVar11 = gains[2] * gains[2] + *gains * *gains + gains[1] * gains[1];
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    auVar12 = vsqrtss_avx(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11));
    fVar11 = auVar12._0_4_;
  }
  if (fVar11 <= 0.0) {
    gains[0] = 0.0;
    gains[1] = 0.0;
    fVar11 = 0.0;
  }
  else {
    *gains = *gains / fVar11;
    gains[1] = gains[1] / fVar11;
    fVar11 = gains[2] / fVar11;
  }
  gains[2] = fVar11;
  *local_38 = mVar1;
  return uVar6;
}

Assistant:

VECTORIZE int mixed_compute_gains(const float position[3], float gains[], mixed_channel_t speakers[], mixed_channel_t *count, struct vbap_data *data){
  char dims = data->dims;
  float best_gain = -INFINITY;
  char best_negs = dims;
  mixed_channel_t best_set = 0;
  
  // If the direction is a zero vector, recast as 0,-1,0 on 3d, and 0,0,1 on 2d.
  // which should give a best approximation for being "on" the position.
  // Ideally we'd drive *all* speakers in that case, but the exact power of them
  // isn't clear to me.
  float direction[3];
  vec_normalize(direction, position);
  if(direction[0] == 0.0 && direction[1] == 0.0 && direction[2] == 0.0){
    if(dims == 3) direction[1] = -1.0;
    else          direction[2] = +1.0;
  }
  // Find set with the highest correspondence to our direction
  for(int i=0; i<data->set_count; ++i){
    float gain[3] = {0.0, 0.0, 0.0};
    float cur_gain = INFINITY;
    char cur_negs = dims;
    
    for(int j=0; j<dims; ++j){
      gain[j] = direction[0] * data->sets[i].inv_mat[0+j*3] +
                direction[1] * data->sets[i].inv_mat[1+j*3] +
                direction[2] * data->sets[i].inv_mat[2+j*3];
      if(gain[j] < cur_gain)
        cur_gain = gain[j];
      if(-0.01 <= gain[j])
        cur_negs--;
    }
    if(best_gain < cur_gain && cur_negs <= best_negs){
      best_gain = cur_gain;
      best_negs = cur_negs;
      best_set = i;
      memcpy(gains, gain, sizeof(float)*3);
    }
  }
  memcpy(speakers, data->sets[best_set].speakers, sizeof(mixed_channel_t)*3);
  // Handle if the best set still does not contain our point.
  char okey = 1;
  for(int i=0; i<dims; ++i){
    if(gains[i] < -0.01){
      gains[i] = 0.0001;
      okey = 0;
    }
  }
  vec_normalize(gains, gains);
  *count = dims;
  return okey;
}